

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poolresourcetester.h
# Opt level: O0

vector<unsigned_long,_std::allocator<unsigned_long>_> *
PoolResourceTester::FreeListSizes<8ul,8ul>(PoolResource<8UL,_8UL> *resource)

{
  long lVar1;
  const_iterator ppLVar2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDI;
  long in_FS_OFFSET;
  ListNode *ptr;
  const_iterator __end0;
  const_iterator __begin0;
  array<PoolResource<8UL,_8UL>::ListNode_*,_2UL> *__range2;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *sizes;
  size_t size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff88;
  value_type_conflict *in_stack_ffffffffffffff90;
  value_type local_48;
  const_iterator local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  memset(in_RDI,0,0x18);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(in_stack_ffffffffffffff88);
  local_38 = std::array<PoolResource<8UL,_8UL>::ListNode_*,_2UL>::begin
                       ((array<PoolResource<8UL,_8UL>::ListNode_*,_2UL> *)in_stack_ffffffffffffff88)
  ;
  ppLVar2 = std::array<PoolResource<8UL,_8UL>::ListNode_*,_2UL>::end
                      ((array<PoolResource<8UL,_8UL>::ListNode_*,_2UL> *)in_stack_ffffffffffffff88);
  for (; local_38 != ppLVar2; local_38 = local_38 + 1) {
    for (local_48 = *local_38; local_48 != (value_type)0x0; local_48 = local_48->m_next) {
    }
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (in_RDI,in_stack_ffffffffffffff90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static std::vector<std::size_t> FreeListSizes(const PoolResource<MAX_BLOCK_SIZE_BYTES, ALIGN_BYTES>& resource)
    {
        auto sizes = std::vector<std::size_t>();
        for (const auto* ptr : resource.m_free_lists) {
            size_t size = 0;
            while (ptr != nullptr) {
                ++size;
                ptr = ptr->m_next;
            }
            sizes.push_back(size);
        }
        return sizes;
    }